

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

int kex_agree_comp(LIBSSH2_SESSION *session,libssh2_endpoint_data *endpoint,uchar *comp,
                  size_t comp_len)

{
  LIBSSH2_COMP_METHOD **methodlist;
  char *pcVar1;
  uchar *puVar2;
  LIBSSH2_COMP_METHOD *pLVar3;
  uchar *puVar4;
  size_t sVar5;
  int unaff_R15D;
  
  methodlist = _libssh2_comp_methods(session);
  puVar4 = (uchar *)endpoint->comp_prefs;
  if (puVar4 == (uchar *)0x0) {
    unaff_R15D = -1;
    pLVar3 = *methodlist;
    while (pLVar3 != (LIBSSH2_COMP_METHOD *)0x0) {
      methodlist = methodlist + 1;
      puVar4 = (uchar *)pLVar3->name;
      if (puVar4 == (uchar *)0x0) {
        return -1;
      }
      sVar5 = strlen((char *)puVar4);
      puVar4 = _libssh2_kex_agree_instr(comp,comp_len,puVar4,sVar5);
      if (puVar4 != (uchar *)0x0) {
        endpoint->comp = pLVar3;
        return 0;
      }
      pLVar3 = *methodlist;
    }
  }
  else {
    do {
      if (puVar4 == (uchar *)0x0) {
        return -1;
      }
      if (*puVar4 == '\0') {
        return -1;
      }
      pcVar1 = strchr((char *)puVar4,0x2c);
      if (pcVar1 == (char *)0x0) {
        sVar5 = strlen((char *)puVar4);
      }
      else {
        sVar5 = (long)pcVar1 - (long)puVar4;
      }
      puVar2 = _libssh2_kex_agree_instr(comp,comp_len,puVar4,sVar5);
      if (puVar2 == (uchar *)0x0) {
        puVar4 = (uchar *)(pcVar1 + 1);
        if (pcVar1 == (char *)0x0) {
          puVar4 = (uchar *)0x0;
        }
      }
      else {
        pLVar3 = (LIBSSH2_COMP_METHOD *)
                 kex_get_method_by_name((char *)puVar4,sVar5,(LIBSSH2_COMMON_METHOD **)methodlist);
        if (pLVar3 == (LIBSSH2_COMP_METHOD *)0x0) {
          unaff_R15D = -1;
        }
        else {
          endpoint->comp = pLVar3;
          unaff_R15D = 0;
        }
      }
    } while (puVar2 == (uchar *)0x0);
  }
  return unaff_R15D;
}

Assistant:

static int kex_agree_comp(LIBSSH2_SESSION *session,
                          libssh2_endpoint_data *endpoint, unsigned char *comp,
                          size_t comp_len)
{
    const LIBSSH2_COMP_METHOD **compp = _libssh2_comp_methods(session);
    unsigned char *s;
    (void)session;

    if(endpoint->comp_prefs) {
        s = (unsigned char *) endpoint->comp_prefs;

        while(s && *s) {
            unsigned char *p = (unsigned char *) strchr((char *) s, ',');
            size_t method_len = (p ? (size_t)(p - s) : strlen((char *) s));

            if(_libssh2_kex_agree_instr(comp, comp_len, s, method_len)) {
                const LIBSSH2_COMP_METHOD *method =
                    (const LIBSSH2_COMP_METHOD *)
                    kex_get_method_by_name((char *) s, method_len,
                                           (const LIBSSH2_COMMON_METHOD **)
                                           compp);

                if(!method) {
                    /* Invalid method -- Should never be reached */
                    return -1;
                }

                endpoint->comp = method;
                return 0;
            }

            s = p ? p + 1 : NULL;
        }
        return -1;
    }

    while(*compp && (*compp)->name) {
        s = _libssh2_kex_agree_instr(comp, comp_len,
                                     (const unsigned char *) (*compp)->name,
                                     strlen((*compp)->name));
        if(s) {
            endpoint->comp = *compp;
            return 0;
        }
        compp++;
    }

    return -1;
}